

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalTableStorage::LocalTableStorage
          (LocalTableStorage *this,ClientContext *context,DataTable *new_data_table,
          LocalTableStorage *parent,idx_t alter_column_index,LogicalType *target_type,
          vector<duckdb::StorageIndex,_true> *bound_columns,Expression *cast_expr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  pointer puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Allocator *pAVar6;
  ClientContext *context_00;
  RowGroupCollection *this_00;
  undefined1 local_68 [32];
  
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->table_ref)._M_data = new_data_table;
  pAVar6 = Allocator::Get(new_data_table->db);
  this->allocator = pAVar6;
  switchD_00569a20::default(&this->row_groups,0,0x91);
  this->deleted_rows = parent->deleted_rows;
  puVar2 = (parent->optimistic_collections).
           super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parent->optimistic_collections).
       super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parent->optimistic_collections).
       super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OptimisticDataWriter::OptimisticDataWriter
            (&this->optimistic_writer,new_data_table,&parent->optimistic_writer);
  this->merged_storage = parent->merged_storage;
  this->is_dropped = false;
  (this->collections_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  context_00 = (ClientContext *)
               shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&parent->row_groups);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
             &stack0xffffffffffffffb8,
             &bound_columns->
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  RowGroupCollection::AlterType
            ((RowGroupCollection *)local_68,context_00,(idx_t)context,
             (LogicalType *)alter_column_index,(vector<duckdb::StorageIndex,_true> *)target_type,
             (Expression *)&stack0xffffffffffffffb8);
  uVar5 = local_68._8_8_;
  uVar4 = local_68._0_8_;
  local_68._0_8_ = (BlockManager *)0x0;
  local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
    }
  }
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
             &stack0xffffffffffffffb8);
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&parent->row_groups);
  RowGroupCollection::CommitDropColumn(this_00,alter_column_index);
  p_Var1 = (parent->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (parent->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (parent->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  local_68._16_8_ =
       (this->append_indexes).indexes.
       super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar3 = (parent->append_indexes).indexes.
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68._0_8_ =
       (this->append_indexes).indexes.
       super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68._8_8_ =
       (this->append_indexes).indexes.
       super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->append_indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parent->append_indexes).indexes.
       super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->append_indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  (this->append_indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parent->append_indexes).indexes.
       super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent->append_indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parent->append_indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent->append_indexes).indexes.
  super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             *)local_68);
  return;
}

Assistant:

LocalTableStorage::LocalTableStorage(ClientContext &context, DataTable &new_data_table, LocalTableStorage &parent,
                                     const idx_t alter_column_index, const LogicalType &target_type,
                                     const vector<StorageIndex> &bound_columns, Expression &cast_expr)
    : table_ref(new_data_table), allocator(Allocator::Get(new_data_table.db)), deleted_rows(parent.deleted_rows),
      optimistic_collections(std::move(parent.optimistic_collections)),
      optimistic_writer(new_data_table, parent.optimistic_writer), merged_storage(parent.merged_storage) {

	// Alter the column type.
	row_groups = parent.row_groups->AlterType(context, alter_column_index, target_type, bound_columns, cast_expr);
	parent.row_groups->CommitDropColumn(alter_column_index);
	parent.row_groups.reset();

	append_indexes.Move(parent.append_indexes);
}